

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darMan.c
# Opt level: O3

void Dar_ManPrintStats(Dar_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Aig_Man_t *p_00;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int level;
  ulong uVar9;
  double dVar10;
  double dVar11;
  uint pCanons [222];
  uint local_3a8 [222];
  
  uVar7 = p->pAig->nObjs[6] + p->pAig->nObjs[5];
  uVar1 = p->nNodesInit;
  dVar11 = (double)(int)(uVar1 - uVar7);
  printf("Tried = %8d. Beg = %8d. End = %8d. Gain = %6d. (%6.2f %%).  Cut mem = %d MB\n",
         (dVar11 * 100.0) / (double)(int)uVar1,(ulong)(uint)p->nNodesTried,(ulong)uVar1,(ulong)uVar7
         ,(ulong)(uVar1 - uVar7),(ulong)(uint)p->nCutMemUsed);
  printf("Cuts = %8d. Tried = %8d. Used = %8d. Bad = %5d. Skipped = %5d. Ave = %.2f.\n",
         (double)((float)p->nCutsUsed / (float)(p->pAig->nObjs[6] + p->pAig->nObjs[5])),
         (ulong)(uint)p->nCutsAll,(ulong)(uint)p->nCutsTried,(ulong)(uint)p->nCutsUsed,
         (ulong)(uint)p->nCutsBad,(ulong)(uint)p->nCutsSkipped);
  p_00 = p->pAig;
  uVar2 = p_00->nBufMax;
  uVar3 = p_00->nObjs[4];
  uVar4 = p_00->nBufReplaces;
  uVar5 = p_00->nBufFixes;
  uVar6 = Aig_ManLevels(p_00);
  level = 0x88cad4;
  printf("Bufs = %5d. BufMax = %5d. BufReplace = %6d. BufFix = %6d.  Levels = %4d.\n",(ulong)uVar3,
         (ulong)uVar2,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6);
  Abc_Print(level,"%s =","Cuts  ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeCuts / 1000000.0);
  Abc_Print(level,"%s =","Eval  ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeEval / 1000000.0);
  Abc_Print(level,"%s =","Other ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeOther / 1000000.0);
  Abc_Print(level,"%s =","TOTAL ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeTotal / 1000000.0);
  if (p->pPars->fVeryVerbose != 0) {
    Dar_LibReturnCanonicals(local_3a8);
    uVar9 = 0;
    do {
      if ((p->ClassGains[uVar9] != 0) || (p->ClassTimes[uVar9] != 0)) {
        printf("%3d : ",uVar9 & 0xffffffff);
        dVar10 = 0.0;
        if (uVar1 != uVar7) {
          dVar10 = ((double)p->ClassGains[uVar9] * 100.0) / dVar11;
        }
        printf("G = %6d (%5.2f %%)  ",dVar10);
        dVar10 = 0.0;
        if (p->nTotalSubgs != 0) {
          dVar10 = ((double)p->ClassSubgs[uVar9] * 100.0) / (double)p->nTotalSubgs;
        }
        printf("S = %8d (%5.2f %%)  ",dVar10);
        if (p->ClassGains[uVar9] == 0) {
          uVar8 = 9999999;
        }
        else {
          uVar8 = (long)p->ClassSubgs[uVar9] / (long)p->ClassGains[uVar9] & 0xffffffff;
        }
        printf("R = %7d   ",uVar8);
        putchar(10);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != 0xde);
    fflush(_stdout);
  }
  return;
}

Assistant:

void Dar_ManPrintStats( Dar_Man_t * p )
{
    unsigned pCanons[222];
    int Gain, i;
    extern void Kit_DsdPrintFromTruth( unsigned * pTruth, int nVars );

    Gain = p->nNodesInit - Aig_ManNodeNum(p->pAig);
    printf( "Tried = %8d. Beg = %8d. End = %8d. Gain = %6d. (%6.2f %%).  Cut mem = %d MB\n", 
        p->nNodesTried, p->nNodesInit, Aig_ManNodeNum(p->pAig), Gain, 100.0*Gain/p->nNodesInit, p->nCutMemUsed );
    printf( "Cuts = %8d. Tried = %8d. Used = %8d. Bad = %5d. Skipped = %5d. Ave = %.2f.\n", 
        p->nCutsAll, p->nCutsTried, p->nCutsUsed, p->nCutsBad, p->nCutsSkipped,
        (float)p->nCutsUsed/Aig_ManNodeNum(p->pAig) );

    printf( "Bufs = %5d. BufMax = %5d. BufReplace = %6d. BufFix = %6d.  Levels = %4d.\n", 
        Aig_ManBufNum(p->pAig), p->pAig->nBufMax, p->pAig->nBufReplaces, p->pAig->nBufFixes, Aig_ManLevels(p->pAig) );
    ABC_PRT( "Cuts  ", p->timeCuts );
    ABC_PRT( "Eval  ", p->timeEval );
    ABC_PRT( "Other ", p->timeOther );
    ABC_PRT( "TOTAL ", p->timeTotal );

    if ( !p->pPars->fVeryVerbose )
        return;
    Dar_LibReturnCanonicals( pCanons );
    for ( i = 0; i < 222; i++ )
    {
        if ( p->ClassGains[i] == 0 && p->ClassTimes[i] == 0 )
            continue;
        printf( "%3d : ", i );
        printf( "G = %6d (%5.2f %%)  ", p->ClassGains[i], Gain? 100.0*p->ClassGains[i]/Gain : 0.0 );
        printf( "S = %8d (%5.2f %%)  ", p->ClassSubgs[i], p->nTotalSubgs? 100.0*p->ClassSubgs[i]/p->nTotalSubgs : 0.0 );
        printf( "R = %7d   ", p->ClassGains[i]? p->ClassSubgs[i]/p->ClassGains[i] : 9999999 );
//        Kit_DsdPrintFromTruth( pCanons + i, 4 );
//        ABC_PRTP( "T", p->ClassTimes[i], p->timeEval );
        printf( "\n" );
    }
    fflush( stdout );
}